

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,(unsigned_char)16>(Thread *this)

{
  uchar *puVar1;
  uchar *puVar2;
  difference_type dVar3;
  undefined1 local_20 [8];
  Simd<unsigned_char,_(unsigned_char)__x10_> val;
  Thread *this_local;
  
  val.v._8_8_ = this;
  _local_20 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  puVar1 = std::begin<unsigned_char,16ul>((uchar (*) [16])local_20);
  puVar2 = std::end<unsigned_char,16ul>((uchar (*) [16])local_20);
  dVar3 = std::
          count_if<unsigned_char*,wabt::interp::Thread::DoSimdIsTrue<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,(unsigned_char)16>()::_lambda(unsigned_char)_1_>
                    (puVar1,puVar2);
  Push<bool>(this,0xf < dVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}